

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capability-test.c++
# Opt level: O1

void __thiscall capnp::_::anon_unknown_0::TestCase676::run(TestCase676 *this)

{
  ClientHook *params_3;
  Reader reader;
  undefined8 uVar1;
  ArrayDisposer *pAVar2;
  long *plVar3;
  char *pcVar4;
  size_t sVar5;
  undefined8 uVar6;
  CapTableBuilder *pCVar7;
  RequestHook *pRVar8;
  SegmentBuilder *node;
  WirePointer *pWVar9;
  PipelineOp *pPVar10;
  PipelineOp *pPVar11;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *extraout_RDX_01;
  void *extraout_RDX_02;
  void *extraout_RDX_03;
  void *extraout_RDX_04;
  void *extraout_RDX_05;
  void *__buf;
  void *extraout_RDX_06;
  void *extraout_RDX_07;
  void *extraout_RDX_08;
  void *extraout_RDX_09;
  void *extraout_RDX_10;
  void *pvVar12;
  int in_R8D;
  Own<capnp::ClientHook,_std::nullptr_t> OVar13;
  int chainedCallCount;
  int callCount;
  Response<capnproto_test::capnp::test::TestInterface::FooResults> response;
  Response<capnproto_test::capnp::test::TestAllTypes> response2;
  DebugComparison<int,_int_&> _kjCondition_3;
  RemotePromise<capnproto_test::capnp::test::TestAllTypes> pipelinePromise2;
  Client client;
  Request<capnproto_test::capnp::test::TestInterface::FooParams,_capnproto_test::capnp::test::TestInterface::FooResults>
  pipelineRequest;
  Request<capnproto_test::capnp::test::TestExtends::GraultParams,_capnproto_test::capnp::test::TestAllTypes>
  pipelineRequest2;
  RemotePromise<capnproto_test::capnp::test::TestPipeline::GetCapResults> promise;
  RemotePromise<capnproto_test::capnp::test::TestInterface::FooResults> pipelinePromise;
  WaitScope waitScope;
  Request<capnproto_test::capnp::test::TestPipeline::GetCapParams,_capnproto_test::capnp::test::TestPipeline::GetCapResults>
  request;
  EventLoop loop;
  undefined1 local_360 [8];
  undefined1 local_358 [32];
  undefined8 uStack_338;
  ArrayDisposer *local_330;
  undefined8 *local_328;
  long *local_320;
  DebugComparison<const_char_(&)[4],_capnp::Text::Reader> local_310;
  undefined8 *local_2e0;
  long *local_2d8;
  SegmentBuilder *local_2d0;
  ClientHook *local_2c8;
  PipelineOp *local_2c0;
  size_t local_2b8;
  bool local_2b0;
  undefined1 local_2a8 [56];
  undefined4 local_270;
  undefined4 uStack_26c;
  long *plStack_268;
  Request<capnproto_test::capnp::test::TestInterface::FooParams,_capnproto_test::capnp::test::TestInterface::FooResults>
  local_260;
  ArrayPtr<const_char> local_228;
  Request<capnproto_test::capnp::test::TestExtends::GraultParams,_capnproto_test::capnp::test::TestAllTypes>
  local_218;
  undefined1 local_1e0 [48];
  RequestHook *local_1b0;
  Request<capnproto_test::capnp::test::TestInterface::FooParams,_capnproto_test::capnp::test::TestInterface::FooResults>
  local_1a8;
  undefined4 local_170;
  long local_168;
  undefined8 uStack_160;
  char *local_158;
  undefined *puStack_150;
  undefined8 local_148;
  char *local_140;
  undefined *puStack_138;
  undefined8 local_130;
  Request<capnproto_test::capnp::test::TestPipeline::GetCapParams,_capnproto_test::capnp::test::TestPipeline::GetCapResults>
  local_128;
  Maybe<capnp::MessageSize> local_f0;
  Maybe<capnp::MessageSize> local_d8;
  Maybe<capnp::MessageSize> local_c0;
  EventLoop local_a8;
  
  kj::EventLoop::EventLoop(&local_a8);
  local_170 = 0xffffffff;
  local_168 = 0;
  uStack_160 = 0;
  local_1a8.hook.ptr = (RequestHook *)&local_a8;
  kj::EventLoop::enterScope(&local_a8);
  local_360._4_4_ = 0;
  local_360._0_4_ = 0;
  local_310.right.super_StringPtr.content.ptr = (char *)operator_new(0x28);
  *(long *)((long)local_310.right.super_StringPtr.content.ptr + 8) = 0;
  *(long *)((long)local_310.right.super_StringPtr.content.ptr + 0x10) = 0x6efc48;
  *(undefined1 *)((long)local_310.right.super_StringPtr.content.ptr + 0x18) = 0;
  *(undefined ***)local_310.right.super_StringPtr.content.ptr = &PTR_dispatchCall_006e0068;
  params_3 = (ClientHook *)(local_360 + 4);
  *(ClientHook **)((long)local_310.right.super_StringPtr.content.ptr + 0x20) = params_3;
  local_310.left =
       (char (*) [4])
       &kj::_::HeapDisposer<capnp::_::(anonymous_namespace)::TestPipelineDynamicImpl>::instance;
  OVar13 = Capability::Client::makeLocalClient
                     ((Client *)local_358,
                      (Own<capnp::Capability::Server,_std::nullptr_t> *)&local_310);
  pcVar4 = local_310.right.super_StringPtr.content.ptr;
  if ((long *)local_310.right.super_StringPtr.content.ptr != (long *)0x0) {
    local_310.right.super_StringPtr.content.ptr = (char *)0x0;
    (*(code *)**(undefined8 **)local_310.left)
              (local_310.left,(long)pcVar4 + *(long *)(*(long *)pcVar4 + -0x10),OVar13.ptr);
  }
  local_358._16_8_ = schemas::s_a5a404caa61d4cd0 + 0x48;
  (*(*(_func_int ***)local_358._8_8_)[4])(&local_310);
  uVar1 = local_358._8_8_;
  local_270 = local_310.left._0_4_;
  uStack_26c = local_310.left._4_4_;
  plStack_268 = (long *)local_310.right.super_StringPtr.content.ptr;
  local_2a8._48_8_ = &capnproto_test::capnp::test::TestPipeline::Client::typeinfo;
  if ((ClientHook *)local_358._8_8_ != (ClientHook *)0x0) {
    local_358._8_8_ = (ClientHook *)0x0;
    (*(code *)((SegmentReader *)local_358._0_8_)->arena->_vptr_Arena)
              (local_358._0_8_,
               (_func_int *)((long)(_func_int ***)uVar1 + (long)(*(_func_int ***)uVar1)[-2]));
  }
  local_c0.ptr.isSet = false;
  capnproto_test::capnp::test::TestPipeline::Client::getCapRequest
            (&local_128,(Client *)(local_2a8 + 0x30),&local_c0);
  *(undefined4 *)local_128.super_Builder._builder.data = 0xea;
  kj::heap<capnp::_::TestInterfaceImpl,int&>((kj *)&local_260,(int *)local_360);
  pPVar10 = (PipelineOp *)local_260.super_Builder._builder.capTable;
  local_358._0_8_ = local_260.super_Builder._builder.segment;
  local_358._8_8_ = local_260.super_Builder._builder.capTable + 3;
  if ((PipelineOp *)local_260.super_Builder._builder.capTable == (PipelineOp *)0x0) {
    local_358._8_8_ = (ClientHook *)0x0;
  }
  local_260.super_Builder._builder.capTable = (CapTableBuilder *)0x0;
  OVar13 = Capability::Client::makeLocalClient
                     ((Client *)&local_310.right,
                      (Own<capnp::Capability::Server,_std::nullptr_t> *)local_358);
  uVar1 = local_358._8_8_;
  if ((ClientHook *)local_358._8_8_ != (ClientHook *)0x0) {
    local_358._8_8_ = (ClientHook *)0x0;
    (***(_func_int ***)local_358._0_8_)
              (local_358._0_8_,
               (_func_int *)((long)(_func_int ***)uVar1 + (long)(*(_func_int ***)uVar1)[-2]),
               OVar13.ptr);
  }
  local_310.left = (char (*) [4])&Capability::Client::typeinfo;
  local_358._0_8_ = local_128.super_Builder._builder.segment;
  local_358._8_8_ = local_128.super_Builder._builder.capTable;
  local_358._16_8_ = local_128.super_Builder._builder.pointers;
  PointerBuilder::setCapability
            ((PointerBuilder *)local_358,(Own<capnp::ClientHook,_std::nullptr_t> *)&local_310.right)
  ;
  sVar5 = local_310.right.super_StringPtr.content.size_;
  pvVar12 = extraout_RDX;
  if ((long *)local_310.right.super_StringPtr.content.size_ != (long *)0x0) {
    local_310.right.super_StringPtr.content.size_ = 0;
    (*(code *)**(undefined8 **)local_310.right.super_StringPtr.content.ptr)
              (local_310.right.super_StringPtr.content.ptr,sVar5 + *(long *)(*(long *)sVar5 + -0x10)
              );
    pvVar12 = extraout_RDX_00;
  }
  pCVar7 = local_260.super_Builder._builder.capTable;
  if (local_260.super_Builder._builder.capTable != (CapTableBuilder *)0x0) {
    local_260.super_Builder._builder.capTable = (CapTableBuilder *)0x0;
    (*(code *)(((local_260.super_Builder._builder.segment)->super_SegmentReader).arena)->_vptr_Arena
    )(local_260.super_Builder._builder.segment,
      (_func_int *)
      ((long)&(pCVar7->super_CapTableReader)._vptr_CapTableReader +
      (long)(pCVar7->super_CapTableReader)._vptr_CapTableReader[-2]));
    pvVar12 = extraout_RDX_01;
  }
  Request<capnproto_test::capnp::test::TestPipeline::GetCapParams,_capnproto_test::capnp::test::TestPipeline::GetCapResults>
  ::send((Request<capnproto_test::capnp::test::TestPipeline::GetCapParams,_capnproto_test::capnp::test::TestPipeline::GetCapResults>
          *)local_1e0,(int)&local_128,pvVar12,(size_t)pPVar10,in_R8D);
  AnyPointer::Pipeline::getPointerField((Pipeline *)local_358,(Pipeline *)(local_1e0 + 8),1);
  local_310.left = (char (*) [4])local_358._0_8_;
  local_310.right.super_StringPtr.content.ptr = (char *)local_358._8_8_;
  local_310.right.super_StringPtr.content.size_ = local_358._16_8_;
  local_310.op.content.ptr = (char *)local_358._24_8_;
  local_310.op.content.size_ = (size_t)uStack_338;
  capnproto_test::capnp::test::TestPipeline::Box::Pipeline::getCap
            ((Client *)&local_218,(Pipeline *)&local_310);
  local_d8.ptr.isSet = false;
  capnproto_test::capnp::test::TestInterface::Client::fooRequest
            (&local_260,(Client *)&local_218,&local_d8);
  pvVar12 = local_218.super_Builder._builder.data;
  __buf = extraout_RDX_02;
  if ((long *)local_218.super_Builder._builder.data != (long *)0x0) {
    local_218.super_Builder._builder.data = (long *)0x0;
    (**((local_218.super_Builder._builder.capTable)->super_CapTableReader)._vptr_CapTableReader)
              (local_218.super_Builder._builder.capTable,(long)pvVar12 + *(long *)(*pvVar12 + -0x10)
              );
    __buf = extraout_RDX_03;
  }
  pPVar11 = (PipelineOp *)local_310.op.content.ptr;
  sVar5 = local_310.right.super_StringPtr.content.size_;
  if ((WirePointer *)local_310.right.super_StringPtr.content.size_ != (WirePointer *)0x0) {
    local_310.right.super_StringPtr.content.size_ = 0;
    local_310.op.content.ptr = (char *)0x0;
    pPVar10 = pPVar11;
    (***(_func_int ***)local_310.op.content.size_)
              (local_310.op.content.size_,sVar5,8,pPVar11,pPVar11,0);
    in_R8D = (int)pPVar10;
    pPVar10 = pPVar11;
    __buf = extraout_RDX_04;
  }
  pcVar4 = local_310.right.super_StringPtr.content.ptr;
  if ((ClientHook *)local_310.right.super_StringPtr.content.ptr != (ClientHook *)0x0) {
    local_310.right.super_StringPtr.content.ptr = (char *)0x0;
    (*(code *)((SegmentReader *)*local_310.left)->arena->_vptr_Arena)
              (local_310.left,
               (_func_int *)((long)(_func_int ***)pcVar4 + (long)(*(_func_int ***)pcVar4)[-2]));
    __buf = extraout_RDX_05;
  }
  *(undefined4 *)local_260.super_Builder._builder.data = 0x141;
  Request<capnproto_test::capnp::test::TestInterface::FooParams,_capnproto_test::capnp::test::TestInterface::FooResults>
  ::send(&local_1a8,(int)&local_260,__buf,(size_t)pPVar10,in_R8D);
  AnyPointer::Pipeline::getPointerField((Pipeline *)local_358,(Pipeline *)(local_1e0 + 8),1);
  local_310.left = (char (*) [4])local_358._0_8_;
  local_310.right.super_StringPtr.content.ptr = (char *)local_358._8_8_;
  local_310.right.super_StringPtr.content.size_ = local_358._16_8_;
  local_310.op.content.ptr = (char *)local_358._24_8_;
  local_310.op.content.size_ = (size_t)uStack_338;
  capnproto_test::capnp::test::TestPipeline::Box::Pipeline::getCap
            ((Client *)&local_2d0,(Pipeline *)&local_310);
  (**(code **)(**(long **)(local_2a8 + *(long *)((long)local_2d0 + 0xffffffffffffffe8) + -0x20) +
              0x20))(local_358);
  local_2a8._8_8_ = local_358._0_8_;
  local_2a8._16_8_ = local_358._8_8_;
  local_2a8._0_8_ = &capnproto_test::capnp::test::TestExtends::Client::typeinfo;
  local_f0.ptr.isSet = false;
  capnproto_test::capnp::test::TestExtends::Client::graultRequest
            (&local_218,(Client *)local_2a8,&local_f0);
  uVar1 = local_2a8._16_8_;
  pvVar12 = extraout_RDX_06;
  if ((ClientHook *)local_2a8._16_8_ != (ClientHook *)0x0) {
    local_2a8._16_8_ = (ClientHook *)0x0;
    (*(code *)((SegmentReader *)local_2a8._8_8_)->arena->_vptr_Arena)
              (local_2a8._8_8_,
               (_func_int *)((long)(_func_int ***)uVar1 + (long)(*(_func_int ***)uVar1)[-2]));
    pvVar12 = extraout_RDX_07;
  }
  pPVar11 = local_2c0;
  if (local_2c0 != (PipelineOp *)0x0) {
    local_2c0 = (PipelineOp *)0x0;
    (*(code *)*local_2c8->_vptr_ClientHook)
              (local_2c8,(long)pPVar11 + *(long *)(*(long *)pPVar11 + -0x10));
    pvVar12 = extraout_RDX_08;
  }
  pPVar11 = (PipelineOp *)local_310.op.content.ptr;
  sVar5 = local_310.right.super_StringPtr.content.size_;
  if ((WirePointer *)local_310.right.super_StringPtr.content.size_ != (WirePointer *)0x0) {
    local_310.right.super_StringPtr.content.size_ = 0;
    local_310.op.content.ptr = (char *)0x0;
    pPVar10 = pPVar11;
    (***(_func_int ***)local_310.op.content.size_)
              (local_310.op.content.size_,sVar5,8,pPVar11,pPVar11,0);
    in_R8D = (int)pPVar10;
    pPVar10 = pPVar11;
    pvVar12 = extraout_RDX_09;
  }
  pcVar4 = local_310.right.super_StringPtr.content.ptr;
  if ((ClientHook *)local_310.right.super_StringPtr.content.ptr != (ClientHook *)0x0) {
    local_310.right.super_StringPtr.content.ptr = (char *)0x0;
    (*(code *)((SegmentReader *)*local_310.left)->arena->_vptr_Arena)
              (local_310.left,
               (_func_int *)((long)(_func_int ***)pcVar4 + (long)(*(_func_int ***)pcVar4)[-2]));
    pvVar12 = extraout_RDX_10;
  }
  Request<capnproto_test::capnp::test::TestExtends::GraultParams,_capnproto_test::capnp::test::TestAllTypes>
  ::send((Request<capnproto_test::capnp::test::TestExtends::GraultParams,_capnproto_test::capnp::test::TestAllTypes>
          *)local_2a8,(int)&local_218,pvVar12,(size_t)pPVar10,in_R8D);
  uStack_338 = (ArrayDisposer *)0x0;
  local_330 = (ArrayDisposer *)0x0;
  local_358._16_8_ = (WirePointer *)0x0;
  local_358._24_8_ = (PipelineOp *)0x0;
  local_358._0_8_ = (SegmentBuilder *)0x0;
  local_358._8_8_ = (ClientHook *)0x0;
  RemotePromise<capnproto_test::capnp::test::TestPipeline::GetCapResults>::operator=
            ((RemotePromise<capnproto_test::capnp::test::TestPipeline::GetCapResults> *)local_1e0,
             (RemotePromise<capnproto_test::capnp::test::TestPipeline::GetCapResults> *)local_358);
  pAVar2 = uStack_338;
  uVar1 = local_358._24_8_;
  if ((PipelineOp *)local_358._24_8_ != (PipelineOp *)0x0) {
    local_358._24_8_ = (PipelineOp *)0x0;
    uStack_338 = (ArrayDisposer *)0x0;
    (**local_330->_vptr_ArrayDisposer)(local_330,uVar1,8,pAVar2,pAVar2,0);
  }
  uVar1 = local_358._16_8_;
  if ((WirePointer *)local_358._16_8_ != (WirePointer *)0x0) {
    local_358._16_8_ = (WirePointer *)0x0;
    (***(_func_int ***)local_358._8_8_)
              (local_358._8_8_,
               (long)&((WireValue<uint32_t>_conflict *)uVar1)->value +
               *(long *)((long)*(WirePointer *)uVar1 + -0x10));
  }
  uVar1 = local_358._0_8_;
  if ((PromiseNode *)local_358._0_8_ != (PromiseNode *)0x0) {
    local_358._0_8_ = (SegmentBuilder *)0x0;
    kj::_::PromiseDisposer::dispose((PromiseArenaMember *)uVar1);
  }
  local_358._0_8_ = local_358._0_8_ & 0xffffffff00000000;
  local_358._16_8_ = " == ";
  local_358._24_8_ = &DAT_00000005;
  if ((local_360._4_4_ != 0) && (kj::_::Debug::minSeverity < 3)) {
    local_310.left = (char (*) [4])((ulong)local_310.left & 0xffffffff00000000);
    local_358._8_8_ = params_3;
    uStack_338._0_1_ = local_360._4_4_ == 0;
    kj::_::Debug::log<char_const(&)[36],kj::_::DebugComparison<int,int&>&,int,int&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/capability-test.c++"
               ,0x2bd,ERROR,
               "\"failed: expected \" \"(0) == (callCount)\", _kjCondition, 0, callCount",
               (char (*) [36])"failed: expected (0) == (callCount)",
               (DebugComparison<int,_int_&> *)local_358,(int *)&local_310,(int *)params_3);
  }
  local_358._0_8_ = local_358._0_8_ & 0xffffffff00000000;
  local_358._16_8_ = " == ";
  local_358._24_8_ = &DAT_00000005;
  uStack_338 = (ArrayDisposer *)CONCAT71(uStack_338._1_7_,local_360._0_4_ == 0);
  local_358._8_8_ = (ClientHook *)local_360;
  if ((local_360._0_4_ != 0) && (kj::_::Debug::minSeverity < 3)) {
    local_310.left = (char (*) [4])((ulong)local_310.left & 0xffffffff00000000);
    kj::_::Debug::log<char_const(&)[43],kj::_::DebugComparison<int,int&>&,int,int&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/capability-test.c++"
               ,0x2be,ERROR,
               "\"failed: expected \" \"(0) == (chainedCallCount)\", _kjCondition, 0, chainedCallCount"
               ,(char (*) [43])"failed: expected (0) == (chainedCallCount)",
               (DebugComparison<int,_int_&> *)local_358,(int *)&local_310,(int *)local_360);
  }
  local_140 = 
  "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/capability-test.c++"
  ;
  puStack_138 = &DAT_004fd5db;
  local_130 = 0x13000002c0;
  kj::Promise<capnp::Response<capnproto_test::capnp::test::TestInterface::FooResults>_>::wait
            ((Promise<capnp::Response<capnproto_test::capnp::test::TestInterface::FooResults>_> *)
             local_358,&local_1a8);
  local_1b0 = (RequestHook *)0x53814d;
  if (uStack_338._4_2_ == 0) {
    local_2b8._0_4_ = 0x7fffffff;
    local_2c8 = (ClientHook *)0x0;
    local_2c0 = (PipelineOp *)0x0;
    local_2d0 = (SegmentBuilder *)0x0;
  }
  else {
    local_2c8 = (ClientHook *)local_358._8_8_;
    local_2c0 = (PipelineOp *)local_358._24_8_;
    local_2d0 = (SegmentBuilder *)local_358._0_8_;
    local_2b8._0_4_ = local_330._0_4_;
  }
  local_228 = (ArrayPtr<const_char>)
              PointerReader::getBlob<capnp::Text>((PointerReader *)&local_2d0,(void *)0x0,0);
  kj::_::DebugExpression<char_const(&)[4]>::operator==
            (&local_310,(DebugExpression<char_const(&)[4]> *)&local_1b0,(Reader *)&local_228);
  if ((local_310.result == false) && (kj::_::Debug::minSeverity < 3)) {
    if (uStack_338._4_2_ == 0) {
      local_2b8._0_4_ = 0x7fffffff;
      local_2c8 = (ClientHook *)0x0;
      local_2c0 = (PipelineOp *)0x0;
      local_2d0 = (SegmentBuilder *)0x0;
    }
    else {
      local_2c8 = (ClientHook *)local_358._8_8_;
      local_2c0 = (PipelineOp *)local_358._24_8_;
      local_2d0 = (SegmentBuilder *)local_358._0_8_;
      local_2b8._0_4_ = local_330._0_4_;
    }
    local_228 = (ArrayPtr<const_char>)
                PointerReader::getBlob<capnp::Text>((PointerReader *)&local_2d0,(void *)0x0,0);
    kj::_::Debug::
    log<char_const(&)[46],kj::_::DebugComparison<char_const(&)[4],capnp::Text::Reader>&,char_const(&)[4],capnp::Text::Reader>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/capability-test.c++"
               ,0x2c1,ERROR,
               "\"failed: expected \" \"(\\\"bar\\\") == (response.getX())\", _kjCondition, \"bar\", response.getX()"
               ,(char (*) [46])"failed: expected (\"bar\") == (response.getX())",&local_310,
               (char (*) [4])0x53814d,(Reader *)&local_228);
  }
  local_158 = 
  "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/capability-test.c++"
  ;
  puStack_150 = &DAT_004fd5db;
  local_148 = 0x14000002c3;
  kj::Promise<capnp::Response<capnproto_test::capnp::test::TestAllTypes>_>::wait
            ((Promise<capnp::Response<capnproto_test::capnp::test::TestAllTypes>_> *)&local_310,
             local_2a8);
  reader._reader._41_7_ = local_310._41_7_;
  reader._reader.nestingLimit._0_1_ = local_310.result;
  reader._reader.capTable = (CapTableReader *)local_310.right.super_StringPtr.content.ptr;
  reader._reader.segment = (SegmentReader *)local_310.left;
  reader._reader.data = (void *)local_310.right.super_StringPtr.content.size_;
  reader._reader.pointers = (WirePointer *)local_310.op.content.ptr;
  reader._reader.dataSize = (undefined4)local_310.op.content.size_;
  reader._reader.pointerCount = local_310.op.content.size_._4_2_;
  reader._reader._38_2_ = local_310.op.content.size_._6_2_;
  checkTestMessage(reader);
  local_2c8 = (ClientHook *)(local_360 + 4);
  local_2b0 = local_360._4_4_ == 3;
  local_2d0._0_4_ = 3;
  local_2c0 = (PipelineOp *)0x4fd0ae;
  local_2b8 = 5;
  if ((!local_2b0) && (kj::_::Debug::minSeverity < 3)) {
    local_228.ptr._0_4_ = 3;
    kj::_::Debug::log<char_const(&)[36],kj::_::DebugComparison<int,int&>&,int,int&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/capability-test.c++"
               ,0x2c6,ERROR,
               "\"failed: expected \" \"(3) == (callCount)\", _kjCondition, 3, callCount",
               (char (*) [36])"failed: expected (3) == (callCount)",
               (DebugComparison<int,_int_&> *)&local_2d0,(int *)&local_228,(int *)local_2c8);
  }
  local_2b0 = local_360._0_4_ == 1;
  local_2d0 = (SegmentBuilder *)CONCAT44(local_2d0._4_4_,1);
  local_2c0 = (PipelineOp *)0x4fd0ae;
  local_2b8 = 5;
  local_2c8 = (ClientHook *)local_360;
  if ((!local_2b0) && (kj::_::Debug::minSeverity < 3)) {
    local_228.ptr._0_4_ = 1;
    kj::_::Debug::log<char_const(&)[43],kj::_::DebugComparison<int,int&>&,int,int&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/capability-test.c++"
               ,0x2c7,ERROR,
               "\"failed: expected \" \"(1) == (chainedCallCount)\", _kjCondition, 1, chainedCallCount"
               ,(char (*) [43])"failed: expected (1) == (chainedCallCount)",
               (DebugComparison<int,_int_&> *)&local_2d0,(int *)&local_228,(int *)local_360);
  }
  plVar3 = local_2d8;
  if (local_2d8 != (long *)0x0) {
    local_2d8 = (long *)0x0;
    (**(code **)*local_2e0)(local_2e0,(long)plVar3 + *(long *)(*plVar3 + -0x10));
  }
  plVar3 = local_320;
  if (local_320 != (long *)0x0) {
    local_320 = (long *)0x0;
    (**(code **)*local_328)(local_328,(long)plVar3 + *(long *)(*plVar3 + -0x10));
  }
  uVar6 = local_2a8._32_8_;
  uVar1 = local_2a8._24_8_;
  if ((WirePointer *)local_2a8._24_8_ != (WirePointer *)0x0) {
    local_2a8._24_8_ = (WirePointer *)0x0;
    local_2a8._32_4_ = 0;
    local_2a8._36_2_ = 0;
    local_2a8._38_2_ = 0;
    (***(_func_int ***)local_2a8._40_8_)(local_2a8._40_8_,uVar1,8,uVar6,uVar6,0);
  }
  uVar1 = local_2a8._16_8_;
  if ((ClientHook *)local_2a8._16_8_ != (ClientHook *)0x0) {
    local_2a8._16_8_ = (ClientHook *)0x0;
    (*(code *)((SegmentReader *)local_2a8._8_8_)->arena->_vptr_Arena)
              (local_2a8._8_8_,
               (_func_int *)((long)(_func_int ***)uVar1 + (long)(*(_func_int ***)uVar1)[-2]));
  }
  uVar1 = local_2a8._0_8_;
  if ((SegmentBuilder *)local_2a8._0_8_ != (SegmentBuilder *)0x0) {
    local_2a8._0_8_ = (SegmentBuilder *)0x0;
    kj::_::PromiseDisposer::dispose((PromiseArenaMember *)uVar1);
  }
  pRVar8 = local_218.hook.ptr;
  if (local_218.hook.ptr != (RequestHook *)0x0) {
    local_218.hook.ptr = (RequestHook *)0x0;
    (**(local_218.hook.disposer)->_vptr_Disposer)
              (local_218.hook.disposer,
               (_func_int *)((long)&pRVar8->_vptr_RequestHook + (long)pRVar8->_vptr_RequestHook[-2])
              );
  }
  uVar1 = local_1a8.super_Builder._builder._32_8_;
  pWVar9 = local_1a8.super_Builder._builder.pointers;
  if (local_1a8.super_Builder._builder.pointers != (WirePointer *)0x0) {
    local_1a8.super_Builder._builder.pointers = (WirePointer *)0x0;
    local_1a8.super_Builder._builder.dataSize = 0;
    local_1a8.super_Builder._builder.pointerCount = 0;
    local_1a8.super_Builder._builder._38_2_ = 0;
    (**(local_1a8.hook.disposer)->_vptr_Disposer)(local_1a8.hook.disposer,pWVar9,8,uVar1,uVar1,0);
  }
  pvVar12 = local_1a8.super_Builder._builder.data;
  if ((long *)local_1a8.super_Builder._builder.data != (long *)0x0) {
    local_1a8.super_Builder._builder.data = (long *)0x0;
    (**((local_1a8.super_Builder._builder.capTable)->super_CapTableReader)._vptr_CapTableReader)
              (local_1a8.super_Builder._builder.capTable,(long)pvVar12 + *(long *)(*pvVar12 + -0x10)
              );
  }
  node = local_1a8.super_Builder._builder.segment;
  if (local_1a8.super_Builder._builder.segment != (SegmentBuilder *)0x0) {
    local_1a8.super_Builder._builder.segment = (SegmentBuilder *)0x0;
    kj::_::PromiseDisposer::dispose((PromiseArenaMember *)node);
  }
  pRVar8 = local_260.hook.ptr;
  if (local_260.hook.ptr != (RequestHook *)0x0) {
    local_260.hook.ptr = (RequestHook *)0x0;
    (**(local_260.hook.disposer)->_vptr_Disposer)
              (local_260.hook.disposer,
               (_func_int *)((long)&pRVar8->_vptr_RequestHook + (long)pRVar8->_vptr_RequestHook[-2])
              );
  }
  uVar6 = local_1e0._32_8_;
  uVar1 = local_1e0._24_8_;
  if ((WirePointer *)local_1e0._24_8_ != (WirePointer *)0x0) {
    local_1e0._24_8_ = (WirePointer *)0x0;
    local_1e0._32_8_ = 0;
    (***(_func_int ***)local_1e0._40_8_)(local_1e0._40_8_,uVar1,8,uVar6,uVar6,0);
  }
  uVar1 = local_1e0._16_8_;
  if ((PipelineHook *)local_1e0._16_8_ != (PipelineHook *)0x0) {
    local_1e0._16_8_ = (PipelineHook *)0x0;
    (**((CapTableReader *)local_1e0._8_8_)->_vptr_CapTableReader)
              (local_1e0._8_8_,
               (_func_int *)((long)(_func_int ***)uVar1 + (long)(*(_func_int ***)uVar1)[-2]));
  }
  uVar1 = local_1e0._0_8_;
  if ((PromiseNode *)local_1e0._0_8_ != (PromiseNode *)0x0) {
    local_1e0._0_8_ = (SegmentBuilder *)0x0;
    kj::_::PromiseDisposer::dispose((PromiseArenaMember *)uVar1);
  }
  pRVar8 = local_128.hook.ptr;
  if (local_128.hook.ptr != (RequestHook *)0x0) {
    local_128.hook.ptr = (RequestHook *)0x0;
    (**(local_128.hook.disposer)->_vptr_Disposer)
              (local_128.hook.disposer,
               (_func_int *)((long)&pRVar8->_vptr_RequestHook + (long)pRVar8->_vptr_RequestHook[-2])
              );
  }
  plVar3 = plStack_268;
  if (plStack_268 != (long *)0x0) {
    plStack_268 = (long *)0x0;
    (*(code *)**(undefined8 **)CONCAT44(uStack_26c,local_270))
              ((undefined8 *)CONCAT44(uStack_26c,local_270),
               (long)plVar3 + *(long *)(*plVar3 + -0x10));
  }
  if (local_168 == 0) {
    kj::EventLoop::leaveScope((EventLoop *)local_1a8.hook.ptr);
  }
  kj::EventLoop::~EventLoop(&local_a8);
  return;
}

Assistant:

TEST(Capability, DynamicServerPipelining) {
  kj::EventLoop loop;
  kj::WaitScope waitScope(loop);

  int callCount = 0;
  int chainedCallCount = 0;
  test::TestPipeline::Client client =
      DynamicCapability::Client(kj::heap<TestPipelineDynamicImpl>(callCount))
          .castAs<test::TestPipeline>();

  auto request = client.getCapRequest();
  request.setN(234);
  request.setInCap(test::TestInterface::Client(kj::heap<TestInterfaceImpl>(chainedCallCount)));

  auto promise = request.send();

  auto pipelineRequest = promise.getOutBox().getCap().fooRequest();
  pipelineRequest.setI(321);
  auto pipelinePromise = pipelineRequest.send();

  auto pipelineRequest2 = promise.getOutBox().getCap().castAs<test::TestExtends>().graultRequest();
  auto pipelinePromise2 = pipelineRequest2.send();

  promise = nullptr;  // Just to be annoying, drop the original promise.

  EXPECT_EQ(0, callCount);
  EXPECT_EQ(0, chainedCallCount);

  auto response = pipelinePromise.wait(waitScope);
  EXPECT_EQ("bar", response.getX());

  auto response2 = pipelinePromise2.wait(waitScope);
  checkTestMessage(response2);

  EXPECT_EQ(3, callCount);
  EXPECT_EQ(1, chainedCallCount);
}